

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::NearestNeighborsIndex::Clear(NearestNeighborsIndex *this)

{
  NearestNeighborsIndex *this_local;
  
  google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::Clear
            (&this->floatsamples_);
  this->numberofdimensions_ = 0;
  clear_IndexType(this);
  clear_DistanceFunction(this);
  return;
}

Assistant:

void NearestNeighborsIndex::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.NearestNeighborsIndex)
  floatsamples_.Clear();
  numberofdimensions_ = 0;
  clear_IndexType();
  clear_DistanceFunction();
}